

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<unsigned_long> __thiscall
capnp::compiler::Compiler::lookup(Compiler *this,uint64_t parent,StringPtr childName)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar1;
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> LStack_38;
  
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *)&LStack_38,
             parent + 8);
  Impl::lookup((Impl *)this,(uint64_t)(LStack_38.ptr)->ptr,childName);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_>::~Locked(&LStack_38);
  MVar1.ptr.field_1.value = extraout_RDX.value;
  MVar1.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar1.ptr;
}

Assistant:

kj::Maybe<uint64_t> Compiler::lookup(uint64_t parent, kj::StringPtr childName) const {
  return impl.lockExclusive()->get()->lookup(parent, childName);
}